

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# single_file_block_manager.cpp
# Opt level: O3

DatabaseHeader *
duckdb::DatabaseHeader::Read
          (DatabaseHeader *__return_storage_ptr__,MainHeader *main_header,ReadStream *source)

{
  _Alloc_hider _Var1;
  IOException *this;
  unsigned_long value;
  string local_48;
  
  (**source->_vptr_ReadStream)(source,__return_storage_ptr__,8);
  (**source->_vptr_ReadStream)(source,&local_48,8);
  __return_storage_ptr__->meta_block = (idx_t)local_48._M_dataplus._M_p;
  (**source->_vptr_ReadStream)(source,&local_48,8);
  __return_storage_ptr__->free_list = (idx_t)local_48._M_dataplus._M_p;
  (**source->_vptr_ReadStream)(source,&local_48,8);
  __return_storage_ptr__->block_count = (uint64_t)local_48._M_dataplus._M_p;
  (**source->_vptr_ReadStream)(source,&local_48,8);
  _Var1._M_p = (pointer)0x40000;
  if (local_48._M_dataplus._M_p != (pointer)0x0) {
    _Var1._M_p = local_48._M_dataplus._M_p;
  }
  __return_storage_ptr__->block_alloc_size = (idx_t)_Var1._M_p;
  (**source->_vptr_ReadStream)(source,&local_48,8);
  _Var1._M_p = (pointer)0x800;
  if (local_48._M_dataplus._M_p != (pointer)0x0) {
    _Var1._M_p = local_48._M_dataplus._M_p;
  }
  __return_storage_ptr__->vector_size = (idx_t)_Var1._M_p;
  if (_Var1._M_p == (pointer)0x800) {
    _Var1._M_p = &DAT_00000001;
    if (main_header->version_number != 0x40) {
      (**source->_vptr_ReadStream)(source,&local_48,8);
      _Var1._M_p = local_48._M_dataplus._M_p;
    }
    __return_storage_ptr__->serialization_compatibility = (idx_t)_Var1._M_p;
    return __return_storage_ptr__;
  }
  this = (IOException *)__cxa_allocate_exception(0x10);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,
             "Cannot read database file: DuckDB\'s compiled vector size is %llu bytes, but the file has a vector size of %llu bytes."
             ,"");
  IOException::IOException<unsigned_int,unsigned_long>
            (this,&local_48,0x800,(unsigned_long)_Var1._M_p);
  __cxa_throw(this,&IOException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

DatabaseHeader DatabaseHeader::Read(const MainHeader &main_header, ReadStream &source) {
	DatabaseHeader header;
	header.iteration = source.Read<uint64_t>();
	header.meta_block = source.Read<idx_t>();
	header.free_list = source.Read<idx_t>();
	header.block_count = source.Read<uint64_t>();
	header.block_alloc_size = source.Read<idx_t>();

	// backwards compatibility
	if (!header.block_alloc_size) {
		header.block_alloc_size = DEFAULT_BLOCK_ALLOC_SIZE;
	}

	header.vector_size = source.Read<idx_t>();
	if (!header.vector_size) {
		// backwards compatibility
		header.vector_size = DEFAULT_STANDARD_VECTOR_SIZE;
	}
	if (header.vector_size != STANDARD_VECTOR_SIZE) {
		throw IOException("Cannot read database file: DuckDB's compiled vector size is %llu bytes, but the file has a "
		                  "vector size of %llu bytes.",
		                  STANDARD_VECTOR_SIZE, header.vector_size);
	}
	if (main_header.version_number == 64) {
		// version number 64 does not have the serialization compatibility in the file - default to 1
		header.serialization_compatibility = 1;
	} else {
		// read from the file
		header.serialization_compatibility = source.Read<idx_t>();
	}
	return header;
}